

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

size_t mserialize::detail::
       BuiltinSerializer<std::tuple<std::tuple<int,int>,std::tuple<int,int>>,void>::
       serialized_size_impl<0ul,1ul>(long param_1)

{
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range3) [3];
  size_t result;
  size_t elem_sizes [3];
  long *local_40;
  size_t local_30;
  long local_28;
  size_t local_20;
  long local_10 [2];
  
  local_28 = 0;
  local_10[0] = param_1;
  std::get<0ul,std::tuple<int,int>,std::tuple<int,int>>
            ((tuple<std::tuple<int,_int>,_std::tuple<int,_int>_> *)0x1619ec);
  local_20 = serialized_size<std::tuple<int,int>>((tuple<int,_int> *)0x1619f4);
  std::get<1ul,std::tuple<int,int>,std::tuple<int,int>>
            ((tuple<std::tuple<int,_int>,_std::tuple<int,_int>_> *)0x161a03);
  serialized_size<std::tuple<int,int>>((tuple<int,_int> *)0x161a0b);
  local_30 = 0;
  for (local_40 = &local_28; local_40 != local_10; local_40 = local_40 + 1) {
    local_30 = *local_40 + local_30;
  }
  return local_30;
}

Assistant:

static std::size_t serialized_size_impl(const Tuple<E...>& t, std::index_sequence<I...>)
  {
    using std::get;
    const std::size_t elem_sizes[] = {0, mserialize::serialized_size(get<I>(t))...};

    std::size_t result = 0;
    for (auto s : elem_sizes) { result += s; }
    return result;
  }